

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_length<char16_t,char16_t>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  char16_t cVar1;
  size_t sVar2;
  char16_t *pcVar3;
  ulong uVar4;
  long lVar5;
  char16_t *pcVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  pcVar3 = in_prefix._M_str;
  uVar4 = in_prefix._M_len;
  pcVar6 = in_string._M_str;
  uVar7 = in_string._M_len;
  if (uVar7 < uVar4) {
    return 0;
  }
  sVar8 = 0;
  while( true ) {
    if ((uVar7 == 0) || (uVar4 == 0)) {
      sVar2 = 0;
      if (uVar4 == 0) {
        sVar2 = sVar8;
      }
      return sVar2;
    }
    cVar1 = *pcVar6;
    uVar9 = (uint)(ushort)cVar1;
    lVar10 = 1;
    if ((uVar7 == 1) || (((cVar1 & 0xfc00U) != 0xd800 || ((pcVar6[1] & 0xfc00U) != 0xdc00)))) {
      lVar5 = 1;
    }
    else {
      uVar9 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar6[1] + 0xfca02400;
      lVar5 = 2;
    }
    uVar11 = (uint)(ushort)*pcVar3;
    if (((uVar4 != 1) && ((uVar11 & 0xfc00) == 0xd800)) && ((pcVar3[1] & 0xfc00U) == 0xdc00)) {
      uVar11 = (uint)(ushort)*pcVar3 * 0x400 + (uint)(ushort)pcVar3[1] + 0xfca02400;
      lVar10 = 2;
    }
    if (uVar9 != uVar11) break;
    pcVar6 = pcVar6 + lVar5;
    uVar7 = uVar7 - lVar5;
    pcVar3 = pcVar3 + lVar10;
    uVar4 = uVar4 - lVar10;
    sVar8 = sVar8 + lVar5;
  }
  return 0;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}